

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f wo,Float g,Point2f u,Float *pdf)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [64];
  float fVar10;
  uint uVar11;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  float fVar14;
  undefined1 auVar16 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  Vector3f VVar25;
  undefined1 extraout_var [60];
  
  auVar19._8_56_ = in_register_000012c8;
  auVar19._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar17._4_60_ = in_register_00001284;
  auVar17._0_4_ = g;
  fVar10 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar15 = auVar17._0_16_;
  auVar6 = vandps_avx512vl(auVar15,auVar6);
  auVar7 = auVar19._0_16_;
  if (0.001 <= auVar6._0_4_) {
    auVar6 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
    auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),auVar7);
    auVar12._0_4_ = auVar6._0_4_ / auVar13._0_4_;
    auVar12._4_12_ = auVar6._4_12_;
    auVar6 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar15,auVar15);
    auVar6 = vfnmadd231ss_fma(auVar6,auVar12,auVar12);
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar6,auVar3);
    auVar13._0_4_ = auVar6._0_4_ / (g + g);
    auVar13._4_12_ = auVar6._4_12_;
  }
  else {
    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7,ZEXT416(0x3f800000));
  }
  uVar11 = auVar13._0_4_;
  auVar6 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0) << 0x40);
  if (auVar6._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar6._0_4_);
  }
  else {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar4 = auVar6._0_4_;
  }
  auVar6 = vmovshdup_avx(auVar7);
  fVar5 = auVar6._0_4_ * 6.2831855;
  fVar8 = cosf(fVar5);
  auVar9._0_4_ = sinf(fVar5);
  auVar9._4_60_ = extraout_var;
  if (pdf != (Float *)0x0) {
    auVar6 = vfmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)(g + g)),ZEXT416(uVar11),auVar6);
    auVar15 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
    auVar6 = vmaxss_avx(auVar7,ZEXT816(0) << 0x20);
    if (auVar6._0_4_ < 0.0) {
      fVar5 = sqrtf(auVar6._0_4_);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar5 = auVar6._0_4_;
    }
    *pdf = (auVar15._0_4_ * 0.07957747) / (auVar7._0_4_ * fVar5);
  }
  auVar15._8_8_ = in_XMM0_Qb;
  auVar15._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15 = vmovshdup_avx(auVar15);
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar6 = vminss_avx(auVar16,ZEXT416((uint)fVar4));
  uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar4 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar6._0_4_);
  auVar20._8_4_ = 0x80000000;
  auVar20._0_8_ = 0x8000000080000000;
  auVar20._12_4_ = 0x80000000;
  auVar6 = vminss_avx(auVar16,ZEXT416(uVar11));
  auVar7._4_4_ = in_XMM1_Db;
  auVar7._0_4_ = fVar10;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = in_XMM1_Dd;
  auVar7 = vpternlogd_avx512vl(auVar16,auVar7,auVar20,0xf8);
  fVar14 = auVar7._0_4_;
  auVar21._0_4_ = -1.0 / (fVar10 + fVar14);
  fVar24 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar1 = vcmpss_avx512f(ZEXT416(uVar11),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar5 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar6._0_4_);
  auVar6 = vinsertps_avx(auVar9._0_16_,ZEXT416((uint)fVar8),0x10);
  auVar18._0_4_ = auVar6._0_4_ * fVar4;
  auVar18._4_4_ = auVar6._4_4_ * fVar4;
  auVar18._8_4_ = auVar6._8_4_ * fVar4;
  auVar18._12_4_ = auVar6._12_4_ * fVar4;
  fVar4 = fVar24 * auVar15._0_4_ * auVar21._0_4_;
  auVar6 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)(fVar14 * fVar4)),0x10);
  auVar22._0_4_ = fVar24 * fVar24 * fVar14;
  auVar22._4_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.y * 0.0;
  auVar22._8_4_ = (float)in_XMM0_Qb * 0.0;
  auVar22._12_4_ = (float)((ulong)in_XMM0_Qb >> 0x20) * 0.0;
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  auVar23._8_4_ = 0x3f800000;
  auVar23._0_8_ = 0x3f8000003f800000;
  auVar23._12_4_ = 0x3f800000;
  auVar7 = vunpcklps_avx(auVar23,auVar7);
  auVar13 = vfmadd231ps_fma(auVar7,auVar22,auVar21);
  auVar7 = vshufps_avx(auVar18,auVar18,0xe1);
  VVar25.super_Tuple3<pbrt::Vector3,_float>.x =
       fVar24 * fVar5 + auVar6._0_4_ * auVar18._0_4_ + auVar13._0_4_ * auVar7._0_4_;
  VVar25.super_Tuple3<pbrt::Vector3,_float>.y =
       wo.super_Tuple3<pbrt::Vector3,_float>.y * fVar5 +
       auVar6._4_4_ * auVar18._4_4_ + auVar13._4_4_ * auVar7._4_4_;
  auVar6 = vmovshdup_avx(auVar18);
  VVar25.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar10 * fVar5 + (fVar24 * -fVar14 * auVar6._0_4_ - auVar15._0_4_ * auVar18._0_4_);
  return (Vector3f)VVar25.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f SampleHenyeyGreenstein(Vector3f wo, Float g, Point2f u, Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}